

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-writer2.cc
# Opt level: O0

void __thiscall mp::BinaryFormatter::nput(BinaryFormatter *this,File *nm,double r)

{
  long lVar1;
  File *in_RSI;
  File *in_RDI;
  BinaryFormatter *in_XMM0_Qa;
  short sh;
  long L;
  double x;
  
  if (((double)in_XMM0_Qa <= 2147483647.0) && (-2147483648.0 <= (double)in_XMM0_Qa)) {
    lVar1 = (long)(double)in_XMM0_Qa;
    if (((double)in_XMM0_Qa == (double)lVar1) && (!NAN((double)in_XMM0_Qa) && !NAN((double)lVar1)))
    {
      if ((short)lVar1 == lVar1) {
        apr((BinaryFormatter *)in_RDI,in_RSI,"s%h",(ulong)(uint)(int)(short)lVar1);
        return;
      }
      apr((BinaryFormatter *)in_RDI,in_RSI,"l%l",lVar1);
      return;
    }
  }
  apr(in_XMM0_Qa,in_RDI,(char *)in_RSI,"n%g");
  return;
}

Assistant:

void BinaryFormatter::nput(File& nm, double r)
{
  double x;
  long L;
  short sh;

  if ((x = r) <= 2147483647.
      && x >= -2147483648.
      && (L = (long)x, (double)x == L)) {
    sh = (short)L;
    if (sh == L)
      apr(nm, "s%h", sh);
    else
      apr(nm, "l%l", L);
  }
  else
    apr(nm, "n%g", x);
}